

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void ch_object_print(ch_object *object)

{
  ch_object *object_local;
  
  switch(object->type) {
  case TYPE_FUNCTION:
    printf("FUNCTION");
    break;
  case TYPE_CLOSURE:
    printf("CLOSURE FUNCTION");
    break;
  case TYPE_UPVALUE:
    printf("UPVALUE");
    break;
  case TYPE_NATIVE:
    printf("NATIVE");
    break;
  case TYPE_STRING:
    printf("STRING %s",*(undefined8 *)(object + 2));
  }
  printf("\n");
  return;
}

Assistant:

void ch_object_print(ch_object* object) {
  switch(object->type) {
    case TYPE_CLOSURE: {
      printf("CLOSURE FUNCTION");
      break;
    }
    case TYPE_UPVALUE: {
      printf("UPVALUE");
      break;
    }
    case TYPE_FUNCTION: {
      printf("FUNCTION");
      break;
    }
    case TYPE_NATIVE: {
      printf("NATIVE");
      break;
    }
    case TYPE_STRING: {
      printf("STRING %s", AS_STRING(object)->value);
      break;
    }
  }

  printf("\n");
}